

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.cpp
# Opt level: O2

void __thiscall embree::BVHN<4>::~BVHN(BVHN<4> *this)

{
  pointer ppBVar1;
  BVHN<4> *pBVar2;
  size_t i;
  ulong uVar3;
  
  (this->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__BVHN_021da090;
  uVar3 = 0;
  while( true ) {
    ppBVar1 = (this->objects).
              super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->objects).
                      super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <= uVar3)
    break;
    pBVar2 = ppBVar1[uVar3];
    if (pBVar2 != (BVHN<4> *)0x0) {
      (**(code **)((long)(pBVar2->super_AccelData).super_RefCount._vptr_RefCount + 8))();
    }
    uVar3 = uVar3 + 1;
  }
  alignedFree((this->subdiv_patches).items);
  (this->subdiv_patches).size_active = 0;
  (this->subdiv_patches).size_alloced = 0;
  (this->subdiv_patches).items = (char *)0x0;
  std::_Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>::~_Vector_base
            (&(this->objects).
              super__Vector_base<embree::BVHN<4>_*,_std::allocator<embree::BVHN<4>_*>_>);
  FastAllocator::~FastAllocator(&this->alloc);
  return;
}

Assistant:

BVHN<N>::~BVHN ()
  {
    for (size_t i=0; i<objects.size(); i++) 
      delete objects[i];
  }